

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorTables::FieldsByCamelcaseNamesLazyInitInternal
          (FileDescriptorTables *this)

{
  _Hash_node_base *value;
  long lVar1;
  _Hash_node_base *p_Var2;
  PointerStringPair camelcase_key;
  first_type local_28;
  
  p_Var2 = (this->fields_by_number_)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      value = p_Var2[3]._M_nxt;
      lVar1 = 0x50;
      if (*(char *)((long)&value[8]._M_nxt + 2) == '\x01') {
        local_28.first = value[0xc]._M_nxt;
        if ((second_type)local_28.first == (second_type)0x0) {
          lVar1 = 0x28;
          goto LAB_002b7ba0;
        }
      }
      else {
LAB_002b7ba0:
        local_28.first = *(void **)((long)&value->_M_nxt + lVar1);
      }
      local_28.second = *(char **)&((second_type)value[3]._M_nxt)->field_0x0;
      InsertIfNotPresent<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
                (&this->fields_by_camelcase_name_,&local_28,(second_type *)value);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void FileDescriptorTables::FieldsByCamelcaseNamesLazyInitInternal() const {
  for (FieldsByNumberMap::const_iterator it = fields_by_number_.begin();
       it != fields_by_number_.end(); it++) {
    PointerStringPair camelcase_key(FindParentForFieldsByMap(it->second),
                                    it->second->camelcase_name().c_str());
    InsertIfNotPresent(&fields_by_camelcase_name_, camelcase_key,
                            it->second);
  }
}